

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  lyd_node **pplVar1;
  uint8_t *puVar2;
  lys_node *plVar3;
  lys_node *leaf;
  bool bVar4;
  lyd_node *plVar5;
  uint uVar6;
  LYS_NODE LVar7;
  ly_set *__ptr;
  ulong uVar8;
  lyd_node *plVar9;
  ulong uVar10;
  
  if (2 < (uint)op) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x531,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  if (node == (lyd_node *)0x0) {
    return;
  }
  bVar4 = false;
  plVar5 = node;
  do {
    do {
      plVar9 = plVar5;
      LVar7 = plVar9->schema->nodetype;
      if ((((LVar7 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
          (plVar3 = plVar9->schema->child, plVar3 != (lys_node *)0x0)) &&
         (*(int *)((long)&plVar3->name + 4) != 0)) {
        uVar8 = 0;
        do {
          __ptr = lyd_find_instance(plVar9,*(lys_node **)(plVar3->dsc + uVar8 * 8));
          if (__ptr == (ly_set *)0x0) {
            ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                   ,0x54b);
            return;
          }
          uVar6 = __ptr->number;
          if (uVar6 != 0) {
            uVar10 = 0;
            do {
              leaf = (__ptr->set).s[uVar10];
              if (op == 0) {
LAB_00164e95:
                if (((ulong)leaf->child & 0x100000000) != 0) {
                  *(byte *)&leaf->dsc = *(byte *)&leaf->dsc | 8;
                  bVar4 = true;
                  if (*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) goto LAB_00164eb3;
                }
              }
              else if ((*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) &&
                      ((lyd_node *)((lyd_val *)&leaf->parent)->binary == plVar9)) {
                *(byte *)&leaf->dsc = *(byte *)&leaf->dsc | 8;
LAB_00164eb3:
                lyp_parse_value((lys_type *)&((lys_node *)leaf->name)[1].ref,
                                (char **)&leaf->nodetype,(lyxml_elem *)0x0,
                                (lyd_node_leaf_list *)leaf,(lyd_attr *)0x0,(lys_module *)0x0,1,
                                *(byte *)((long)&leaf->dsc + 1) & 1,0);
                uVar6 = __ptr->number;
                bVar4 = true;
              }
              else if (op != 1) goto LAB_00164e95;
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar6);
          }
          free((__ptr->set).s);
          free(__ptr);
          uVar8 = uVar8 + 1;
        } while (uVar8 < *(uint *)((long)&plVar3->name + 4));
        LVar7 = plVar9->schema->nodetype;
      }
    } while (((LVar7 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
            (plVar5 = plVar9->child, plVar9->child != (lyd_node *)0x0));
    if (plVar9 == node) {
LAB_00164f71:
      if (!bVar4) {
        return;
      }
      if (node->parent == (lyd_node *)0x0) {
        return;
      }
      puVar2 = &node->parent->validity;
      *puVar2 = *puVar2 | 4;
      return;
    }
    plVar5 = plVar9->next;
    if (plVar9->next == (lyd_node *)0x0) {
      plVar9 = plVar9->parent;
      do {
        if (plVar9->parent == node->parent) goto LAB_00164f71;
        pplVar1 = &plVar9->next;
        plVar5 = *pplVar1;
        plVar9 = plVar9->parent;
      } while (*pplVar1 == (lyd_node *)0x0);
    }
  } while( true );
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;
    int validity_changed = 0;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_flags & LY_VALUE_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            validity_changed = 1;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link and put unresolved value back */
                                lyp_parse_value(&((struct lys_node_leaf *)leaf_list->schema)->type, &leaf_list->value_str,
                                                NULL, leaf_list, NULL, NULL, 1, leaf_list->dflt, 0);
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT(node->schema->module->ctx);
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (validity_changed && node->parent) {
        node->parent->validity |= LYD_VAL_MAND;
    }
}